

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void addCommandDefinition(CommandInfo *comm)

{
  int n;
  _Elt_pointer ppCVar1;
  CommandInfo **ppCVar2;
  String *in_RDI;
  _Elt_pointer ppCVar3;
  _Elt_pointer ppCVar4;
  _Map_pointer local_40;
  CommandInfo *local_38;
  
  ppCVar1 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  local_40 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  ppCVar3 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur;
  ppCVar4 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_last;
  while (ppCVar3 != ppCVar1) {
    n = (*ppCVar3)->number;
    if ((n == *(int *)&in_RDI[1]._string._M_dataplus._M_p) &&
       ((*ppCVar3)->isbuiltin == (bool)*(char *)&in_RDI[5]._string._M_dataplus._M_p)) {
      ppCVar2 = List<CommandInfo_*>::operator[](&Commands,n);
      error<String,String>("Attempted to redefine command #%1 (%2) as %3",&(*ppCVar2)->name,in_RDI);
    }
    ppCVar3 = ppCVar3 + 1;
    if (ppCVar3 == ppCVar4) {
      ppCVar3 = local_40[1];
      local_40 = local_40 + 1;
      ppCVar4 = ppCVar3 + 0x40;
    }
  }
  List<CommandInfo_*>::append(&Commands,&local_38);
  return;
}

Assistant:

void addCommandDefinition (CommandInfo* comm)
{
	// Ensure that there is no conflicts
	for (CommandInfo* it : Commands)
	{
		if (it->number == comm->number && it->isbuiltin == comm->isbuiltin)
		{
			error ("Attempted to redefine command #%1 (%2) as %3",
				   Commands[comm->number]->name, comm->name);
		}
	}

	Commands << comm;
}